

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tags.hpp
# Opt level: O0

VariableTag * __thiscall Qentem::Tags::TagBit::MakeVariableTag(TagBit *this)

{
  VariableTag *pVVar1;
  VariableTag *tag;
  TagBit *this_local;
  
  pVVar1 = Memory::AllocateInit<Qentem::Tags::VariableTag>();
  this->type_ = Variable;
  this->storage_ = pVVar1;
  return pVVar1;
}

Assistant:

VariableTag *MakeVariableTag() {
        VariableTag *tag = Memory::AllocateInit<VariableTag>();

        type_    = TagType::Variable;
        storage_ = tag;

        return tag;
    }